

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O2

word zzSubMulW(word *b,word *a,size_t n,word w)

{
  ulong *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  
  uVar6 = 0;
  for (sVar7 = 0; auVar4._8_8_ = 0, auVar4._0_8_ = uVar6, n != sVar7; sVar7 = sVar7 + 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = w;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = a[sVar7];
    auVar4 = auVar2 * auVar3 + auVar4;
    uVar5 = auVar4._0_8_;
    puVar1 = b + sVar7;
    uVar6 = *puVar1;
    *puVar1 = *puVar1 - uVar5;
    uVar6 = auVar4._8_8_ + (ulong)(uVar6 < uVar5);
  }
  return uVar6;
}

Assistant:

word zzSubMulW(word b[], const word a[], size_t n, register word w)
{
	register word borrow = 0;
	register dword prod;
	size_t i;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	for (i = 0; i < n; ++i)
	{
		zzMul11(prod, w, a[i]);
		prod = (dword)0 - prod;
		prod += b[i];
		prod -= borrow;
		b[i] = (word)prod;
		borrow = WORD_0 - (word)(prod >> B_PER_W);
	}
	prod = 0, w = 0;
	return borrow;
}